

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doShowObj(QPDFJob *this,QPDF *pdf)

{
  int generation;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  element_type *p;
  element_type *peVar4;
  element_type *peVar5;
  Pipeline *pPVar6;
  runtime_error *this_00;
  byte local_181;
  QPDFObjGen local_150;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  QPDFLogger local_e8;
  QPDFObjectHandle local_d8;
  string local_c8;
  QPDFLogger local_a8;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> local_98;
  allocator<char> local_81;
  string local_80;
  byte local_5a;
  byte local_59;
  undefined1 local_58 [6];
  bool filter;
  bool error;
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle obj;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_28);
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  _Var1 = obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  if ((peVar3->show_trailer & 1U) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    generation = peVar3->show_obj;
    std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this);
    QPDF::getObjectByID((QPDF *)local_58,(int)_Var1._M_pi,generation);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,(QPDFObjectHandle *)local_58);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  }
  else {
    QPDF::getTrailer((QPDF *)&local_38);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_38);
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  }
  local_59 = 0;
  bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_28);
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (((peVar3->show_raw_stream_data & 1U) == 0) &&
       (peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), (peVar3->show_filtered_stream_data & 1U) == 0)) {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar3);
      QPDFLogger::getInfo(&local_a8,SUB81(peVar4,0));
      peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_a8);
      pPVar6 = Pipeline::operator<<(peVar5,"Object is stream.  Dictionary:\n");
      QPDFObjectHandle::getDict(&local_d8);
      QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_c8,&local_d8);
      pPVar6 = Pipeline::operator<<(pPVar6,&local_c8);
      Pipeline::operator<<(pPVar6,"\n");
      std::__cxx11::string::~string((string *)&local_c8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_a8);
    }
    else {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      local_5a = peVar3->show_filtered_stream_data & 1;
      if ((local_5a == 0) ||
         (bVar2 = QPDFObjectHandle::pipeStreamData
                            ((QPDFObjectHandle *)local_28,(Pipeline *)0x0,0,qpdf_dl_all,false,false)
         , bVar2)) {
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar3);
        QPDFLogger::saveToStandardOutput(peVar4,true);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar3);
        QPDFLogger::getSave((QPDFLogger *)&local_98,SUB81(peVar4,0));
        p = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get(&local_98);
        local_181 = 0;
        if ((local_5a & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          local_181 = peVar3->normalize;
        }
        QPDFObjectHandle::pipeStreamData
                  ((QPDFObjectHandle *)local_28,p,(local_181 & 1) * 2,(local_5a & 1) * 3,false,false
                  );
        std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_98);
      }
      else {
        QTC::TC("qpdf","QPDFJob unable to filter",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"unable to filter stream data",&local_81);
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_28,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        local_59 = 1;
      }
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar3);
    QPDFLogger::getInfo(&local_e8,SUB81(peVar4,0));
    peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_e8);
    QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_108,(QPDFObjectHandle *)local_28);
    pPVar6 = Pipeline::operator<<(peVar5,&local_108);
    Pipeline::operator<<(pPVar6,"\n");
    std::__cxx11::string::~string((string *)&local_108);
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_e8);
  }
  if ((local_59 & 1) == 0) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_150 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_28);
  QPDFObjGen::unparse_abi_cxx11_(&local_148,&local_150,',');
  std::operator+(&local_128,"unable to get object ",&local_148);
  std::runtime_error::runtime_error(this_00,(string *)&local_128);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::doShowObj(QPDF& pdf)
{
    QPDFObjectHandle obj;
    if (m->show_trailer) {
        obj = pdf.getTrailer();
    } else {
        obj = pdf.getObjectByID(m->show_obj, m->show_gen);
    }
    bool error = false;
    if (obj.isStream()) {
        if (m->show_raw_stream_data || m->show_filtered_stream_data) {
            bool filter = m->show_filtered_stream_data;
            if (filter && (!obj.pipeStreamData(nullptr, 0, qpdf_dl_all))) {
                QTC::TC("qpdf", "QPDFJob unable to filter");
                obj.warnIfPossible("unable to filter stream data");
                error = true;
            } else {
                // If anything has been written to standard output, this will fail.
                m->log->saveToStandardOutput(true);
                obj.pipeStreamData(
                    m->log->getSave().get(),
                    (filter && m->normalize) ? qpdf_ef_normalize : 0,
                    filter ? qpdf_dl_all : qpdf_dl_none);
            }
        } else {
            *m->log->getInfo() << "Object is stream.  Dictionary:\n"
                               << obj.getDict().unparseResolved() << "\n";
        }
    } else {
        *m->log->getInfo() << obj.unparseResolved() << "\n";
    }
    if (error) {
        throw std::runtime_error("unable to get object " + obj.getObjGen().unparse(','));
    }
}